

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O3

TScreen * ImTui_ImplNcurses_Init(bool mouseSupport,float fps_active,float fps_idle)

{
  ulong uVar1;
  long lVar2;
  ImGuiIO *pIVar3;
  ulong uVar4;
  float fVar5;
  float fVar8;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  
  if (g_screen == (TScreen *)0x0) {
    g_screen = (TScreen *)operator_new(0x18);
    g_screen->nx = 0;
    g_screen->ny = 0;
    *(undefined8 *)&g_screen->nmax = 0;
    g_screen->data = (TCell *)0x0;
  }
  fVar5 = (float)(~-(uint)(fps_idle < 0.0) & (uint)fps_idle |
                 -(uint)(fps_idle < 0.0) & (uint)fps_active);
  if (fps_active <= fVar5) {
    fVar5 = fps_active;
  }
  uVar1 = (ulong)(1e+06 / fps_active);
  uVar4 = (ulong)(1e+06 / fVar5);
  lVar2 = std::chrono::_V2::system_clock::now();
  _ZL7g_vsync_2 = lVar2 / 1000;
  _ZL7g_vsync_0 = (long)(1e+06 / fps_active - 9.223372e+18) & (long)uVar1 >> 0x3f | uVar1;
  _ZL7g_vsync_1 = (long)(1e+06 / fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
  _ZL7g_vsync_3 = _ZL7g_vsync_2;
  initscr();
  use_default_colors();
  start_color();
  cbreak();
  noecho();
  curs_set(0);
  nodelay(_stdscr,1);
  wtimeout(_stdscr,1);
  set_escdelay(0x19);
  keypad(_stdscr,1);
  if (mouseSupport) {
    mouseinterval(0);
    mousemask(0x1fffffff,0);
    puts("\x1b[?1003h");
  }
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0] = 9;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[1] = 0x104;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[2] = 0x105;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[3] = 0x103;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[4] = 0x102;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[5] = 0x153;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[6] = 0x152;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[7] = 0x106;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[8] = 0x168;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[9] = 0x14b;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[10] = 0x14a;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0xb] = 0x107;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0xc] = 0x20;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0xd] = 10;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0xe] = 0x1b;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0xf] = 0x157;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0x10] = 1;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0x11] = 3;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0x12] = 0x16;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0x13] = 0x18;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0x14] = 0x19;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyMap[0x15] = 0x1a;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyRepeatDelay = 0.05;
  pIVar3 = ImGui::GetIO();
  pIVar3->KeyRepeatRate = 0.05;
  if (_stdscr == 0) {
    fVar5 = -1.0;
    fVar8 = -1.0;
  }
  else {
    auVar7 = pshuflw(ZEXT416(*(uint *)(_stdscr + 4)),ZEXT416(*(uint *)(_stdscr + 4)),0x60);
    fVar5 = (float)((auVar7._0_4_ >> 0x10) + 1);
    fVar8 = (float)((auVar7._4_4_ >> 0x10) + 1);
  }
  pIVar3 = ImGui::GetIO();
  IVar6.y = fVar5;
  IVar6.x = fVar8;
  pIVar3->DisplaySize = IVar6;
  return g_screen;
}

Assistant:

ImTui::TScreen * ImTui_ImplNcurses_Init(bool mouseSupport, float fps_active, float fps_idle) {
    if (g_screen == nullptr) {
        g_screen = new ImTui::TScreen();
    }

    if (fps_idle < 0.0) {
        fps_idle = fps_active;
    }
    fps_idle = std::min(fps_active, fps_idle);
    g_vsync = VSync(fps_active, fps_idle);

    initscr();
    use_default_colors();
    start_color();
    cbreak();
    noecho();
    curs_set(0);
    nodelay(stdscr, TRUE);
    wtimeout(stdscr, 1);
    set_escdelay(25);
    keypad(stdscr, true);

    if (mouseSupport) {
        mouseinterval(0);
        mousemask(ALL_MOUSE_EVENTS | REPORT_MOUSE_POSITION, NULL);
        printf("\033[?1003h\n");
    }

    ImGui::GetIO().KeyMap[ImGuiKey_Tab]         = 9;
    ImGui::GetIO().KeyMap[ImGuiKey_LeftArrow]   = 260;
    ImGui::GetIO().KeyMap[ImGuiKey_RightArrow]  = 261;
    ImGui::GetIO().KeyMap[ImGuiKey_UpArrow]     = 259;
    ImGui::GetIO().KeyMap[ImGuiKey_DownArrow]   = 258;
    ImGui::GetIO().KeyMap[ImGuiKey_PageUp]      = 339;
    ImGui::GetIO().KeyMap[ImGuiKey_PageDown]    = 338;
    ImGui::GetIO().KeyMap[ImGuiKey_Home]        = 262;
    ImGui::GetIO().KeyMap[ImGuiKey_End]         = 360;
    ImGui::GetIO().KeyMap[ImGuiKey_Insert]      = 331;
    ImGui::GetIO().KeyMap[ImGuiKey_Delete]      = 330;
    ImGui::GetIO().KeyMap[ImGuiKey_Backspace]   = 263;
    ImGui::GetIO().KeyMap[ImGuiKey_Space]       = 32;
    ImGui::GetIO().KeyMap[ImGuiKey_Enter]       = 10;
    ImGui::GetIO().KeyMap[ImGuiKey_Escape]      = 27;
    ImGui::GetIO().KeyMap[ImGuiKey_KeyPadEnter] = 343;
    ImGui::GetIO().KeyMap[ImGuiKey_A]           = 1;
    ImGui::GetIO().KeyMap[ImGuiKey_C]           = 3;
    ImGui::GetIO().KeyMap[ImGuiKey_V]           = 22;
    ImGui::GetIO().KeyMap[ImGuiKey_X]           = 24;
    ImGui::GetIO().KeyMap[ImGuiKey_Y]           = 25;
    ImGui::GetIO().KeyMap[ImGuiKey_Z]           = 26;

    ImGui::GetIO().KeyRepeatDelay = 0.050;
    ImGui::GetIO().KeyRepeatRate = 0.050;

	int screenSizeX = 0;
	int screenSizeY = 0;

	getmaxyx(stdscr, screenSizeY, screenSizeX);
	ImGui::GetIO().DisplaySize = ImVec2(screenSizeX, screenSizeY);

    return g_screen;
}